

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStoreChecks.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1693b::InstrumentMemoryAccesses::doInitialization
          (InstrumentMemoryAccesses *this,Module *M)

{
  undefined8 uVar1;
  PointerType *pPVar2;
  IntegerType *pIVar3;
  raw_ostream *this_00;
  StringRef SVar4;
  StringRef SVar5;
  StringRef Str;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> params;
  PointerType *local_40;
  void *local_38;
  long lStack_30;
  long local_28;
  
  uVar1 = llvm::Type::getVoidTy(*(LLVMContext **)M);
  pPVar2 = (PointerType *)llvm::Type::getInt8PtrTy(*(LLVMContext **)M,0);
  this->VoidPtrTy = pPVar2;
  pIVar3 = (IntegerType *)llvm::Type::getInt64Ty(*(LLVMContext **)M);
  this->SizeTy = pIVar3;
  local_38 = (void *)0x0;
  lStack_30 = 0;
  local_28 = 0;
  local_40 = this->VoidPtrTy;
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            ((vector<llvm::Type*,std::allocator<llvm::Type*>> *)&local_38,(Type **)&local_40);
  local_40 = (PointerType *)this->SizeTy;
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            ((vector<llvm::Type*,std::allocator<llvm::Type*>> *)&local_38,(Type **)&local_40);
  local_40 = this->VoidPtrTy;
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            ((vector<llvm::Type*,std::allocator<llvm::Type*>> *)&local_38,(Type **)&local_40);
  local_40 = (PointerType *)this->SizeTy;
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            ((vector<llvm::Type*,std::allocator<llvm::Type*>> *)&local_38,(Type **)&local_40);
  llvm::FunctionType::get(uVar1,local_38,lStack_30 - (long)local_38 >> 3,0);
  SVar4.Length = (size_t)"__loadcheck";
  SVar4.Data = (char *)M;
  llvm::Module::getOrInsertFunction(SVar4,(FunctionType *)0xb);
  SVar5.Length = (size_t)"__storecheck";
  SVar5.Data = (char *)M;
  llvm::Module::getOrInsertFunction(SVar5,(FunctionType *)0xc);
  this_00 = (raw_ostream *)llvm::errs();
  Str.Length = 0x1b;
  Str.Data = "[+] doInitialization done \n";
  llvm::raw_ostream::operator<<(this_00,Str);
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return true;
}

Assistant:

bool InstrumentMemoryAccesses::doInitialization(Module &M) {
    Type *VoidTy = Type::getVoidTy(M.getContext());
    VoidPtrTy = Type::getInt8PtrTy(M.getContext());
    SizeTy = IntegerType::getInt64Ty(M.getContext());
    std::vector<Type*> params;
    params.push_back(VoidPtrTy);
    params.push_back(SizeTy);
    params.push_back(VoidPtrTy);
    params.push_back(SizeTy);
    FunctionType *LoadStoreFuncType = FunctionType::get(VoidTy,params,false);
    M.getOrInsertFunction("__loadcheck", LoadStoreFuncType);
    M.getOrInsertFunction("__storecheck", LoadStoreFuncType);
    errs() << "[+] doInitialization done \n";
    return true;
}